

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opts.c
# Opt level: O1

int main(int argc,char **argv)

{
  int iVar1;
  int nargc;
  lfd local_func_data;
  int flag2;
  int flag;
  int bool_type;
  long long_int;
  char *str;
  int local_1bc [5];
  undefined8 local_1a8;
  undefined8 local_1a0;
  zt_opt_def_t local_198;
  undefined1 local_168;
  char *local_160;
  char *local_158;
  code *local_150;
  int *local_148;
  char *local_140;
  undefined1 local_138;
  char *local_130;
  char *local_128;
  code *local_120;
  undefined8 *local_118;
  char *local_110;
  undefined1 local_108;
  char *local_100;
  char *local_f8;
  code *local_f0;
  int *local_e8;
  char *local_e0;
  undefined1 local_d8;
  char *local_d0;
  char *local_c8;
  code *local_c0;
  undefined8 *local_b8;
  char *local_b0;
  undefined1 local_a8;
  undefined8 local_a0;
  undefined8 uStack_98;
  code *local_90;
  int *local_88;
  char *local_80;
  undefined1 local_78;
  char *local_70;
  undefined8 local_68;
  code *local_60;
  int *local_58;
  char *local_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  
  local_148 = local_1bc + 4;
  local_1bc[4] = 0;
  local_118 = &local_1a0;
  local_1a0 = 0;
  local_b8 = &local_1a8;
  local_1a8 = 0;
  local_88 = local_1bc + 3;
  local_1bc[3] = 0;
  local_58 = local_1bc + 2;
  local_1bc[2] = 0;
  local_e8 = local_1bc + 1;
  local_1bc[1] = 0;
  local_198.sopt = 'h';
  local_198.lopt = "help";
  local_198.arg = (char *)0x0;
  local_198.cb = zt_opt_help_stdout;
  local_198.cb_data = "[options]";
  local_198.help = "this help text";
  local_168 = 0x62;
  local_160 = "bool";
  local_158 = "[true|false]";
  local_150 = zt_opt_bool_int;
  local_140 = "boolean test";
  local_138 = 0x73;
  local_130 = "string";
  local_128 = "text";
  local_120 = zt_opt_string;
  local_110 = 
  "This is a really long string intended to overflow the wrap widths so that we can test how well they work.  This is only a test"
  ;
  local_108 = 0x66;
  local_100 = "func";
  local_f8 = "arg";
  local_f0 = local_func_with_args;
  local_e0 = "generic function";
  local_d8 = 0x6c;
  local_d0 = "long";
  local_c8 = "int";
  local_c0 = zt_opt_long;
  local_b0 = "a long integer";
  local_a8 = 0x71;
  local_a0 = 0;
  uStack_98 = 0;
  local_90 = zt_opt_flag_int;
  local_80 = "short only flag";
  local_78 = 0xff;
  local_70 = "quiet";
  local_68 = 0;
  local_60 = zt_opt_flag_int;
  local_50 = "long only flag";
  local_28 = 0;
  uStack_20 = 0;
  local_38 = 0;
  uStack_30 = 0;
  local_48 = 0;
  uStack_40 = 0;
  local_1bc[0] = argc;
  iVar1 = zt_opt_process_args(local_1bc,argv,&local_198,(zt_opt_validate)0x0,(zt_opt_error)0x0);
  if (-1 < iVar1) {
    return 0;
  }
  zt_log_lprintf((zt_log_ty *)0x0,zt_log_err,"Error processing args");
  exit(1);
}

Assistant:

int
main(int argc, char ** argv) {
    int        bool_type        = 0;
    char     * str              = NULL;
    long       long_int         = 0;
    int        flag             = 0;
    int        flag2            = 0;
    struct lfd local_func_data  = {
        0
    };

    #define LONG_DESC "This is a really long string intended to overflow the wrap widths so that we can test how well they work.  This is only a test"
    struct zt_opt_def options[] = {
        { 'h',        "help",     NULL,           zt_opt_help_stdout,   "[options]",      "this help text"   },
        { 'b',        "bool",     "[true|false]", zt_opt_bool_int,      &bool_type,       "boolean test"     },
        { 's',        "string",   "text",         zt_opt_string,        &str,             LONG_DESC          },
        { 'f',        "func",     "arg",          local_func_with_args, &local_func_data, "generic function" },
        { 'l',        "long",     "int",          zt_opt_long,          &long_int,        "a long integer"   },
        { 'q',        ZT_OPT_NLO, NULL,           zt_opt_flag_int,      &flag,            "short only flag"  },
        { ZT_OPT_NSO, "quiet",    NULL,           zt_opt_flag_int,      &flag2,           "long only flag"   },
        { ZT_OPT_END() }
    };

    int               nargc = argc;
    char           ** pargv = argv;

    int               ret   = zt_opt_process_args(&nargc, pargv, options, NULL, NULL);
    if (ret < 0) {
        zt_log_printf(zt_log_err, "Error processing args");
        exit(1);
    }

    return 0;
}